

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

void __thiscall SimpleString::setInternalBufferToNewBuffer(SimpleString *this,size_t bufferSize)

{
  int iVar1;
  TestMemoryAllocator *pTVar2;
  undefined4 extraout_var;
  
  deallocateInternalBuffer(this);
  this->bufferSize_ = bufferSize;
  pTVar2 = stringAllocator_;
  if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
    pTVar2 = defaultNewArrayAllocator();
  }
  iVar1 = (*pTVar2->_vptr_TestMemoryAllocator[2])
                    (pTVar2,bufferSize,
                     "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O1/_deps/cpputest-src/src/CppUTest/SimpleString.cpp"
                     ,0x109);
  this->buffer_ = (char *)CONCAT44(extraout_var,iVar1);
  *(char *)CONCAT44(extraout_var,iVar1) = '\0';
  return;
}

Assistant:

void SimpleString::setInternalBufferToNewBuffer(size_t bufferSize)
{
    deallocateInternalBuffer();

    bufferSize_ = bufferSize;
    buffer_ = allocStringBuffer(bufferSize_, __FILE__, __LINE__);
    buffer_[0] = '\0';
}